

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::JsonStreamParser::SkipWhitespace(JsonStreamParser *this)

{
  ulong uVar1;
  
  while ((((this->p_).length_ != 0 && (uVar1 = (ulong)(byte)*(this->p_).ptr_, uVar1 < 0x21)) &&
         ((0x100003e00U >> (uVar1 & 0x3f) & 1) != 0))) {
    Advance(this);
  }
  return;
}

Assistant:

void JsonStreamParser::SkipWhitespace() {
  while (!p_.empty() && ascii_isspace(*p_.data())) {
    Advance();
  }
}